

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O1

int SUNLinSolFree_Dense(SUNLinearSolver S)

{
  void *__ptr;
  
  if (S != (SUNLinearSolver)0x0) {
    if (S->content != (void *)0x0) {
      __ptr = *(void **)((long)S->content + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)S->content + 8) = 0;
      }
      free(S->content);
      S->content = (void *)0x0;
    }
    if (S->ops != (_generic_SUNLinearSolver_Ops *)0x0) {
      free(S->ops);
      S->ops = (_generic_SUNLinearSolver_Ops *)0x0;
    }
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_Dense(SUNLinearSolver S)
{
  /* return if S is already free */
  if (S == NULL)
    return(SUNLS_SUCCESS);

  /* delete items from contents, then delete generic structure */
  if (S->content) {
    if (PIVOTS(S)) {
      free(PIVOTS(S));
      PIVOTS(S) = NULL;
    }
    free(S->content);  
    S->content = NULL;
  }
  if (S->ops) {
    free(S->ops);  
    S->ops = NULL;
  }
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}